

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::getChrm(float *m,float *whitepoint,uint use_icc,LodePNGICC *icc,LodePNGInfo *info)

{
  uint uVar1;
  int in_EDX;
  float *in_RSI;
  long in_RDI;
  long in_R8;
  float fVar2;
  float fVar3;
  float by;
  float bx;
  float gy;
  float gx;
  float ry;
  float rx;
  float wy;
  float wx;
  size_t i;
  undefined4 in_stack_00000038;
  ulong local_38;
  float in_stack_fffffffffffffff8;
  float in_stack_fffffffffffffffc;
  
  if (in_EDX == 0) {
    if ((*(int *)(in_R8 + 0xbc) == 0) || (*(int *)(in_R8 + 0xe0) != 0)) {
      for (local_38 = 0; local_38 < 9; local_38 = local_38 + 1) {
        *(float *)(in_RDI + local_38 * 4) = getChrm::srgb[local_38];
      }
      *in_RSI = 0.9504559;
      in_RSI[1] = 1.0;
      in_RSI[2] = 1.0890578;
    }
    else {
      fVar2 = (float)*(uint *)(in_R8 + 0xc0) / 100000.0;
      fVar3 = (float)*(uint *)(in_R8 + 0xc4) / 100000.0;
      uVar1 = getChrmMatrixXY(_wy,rx,ry,gx,gy,bx,by,in_stack_fffffffffffffffc,
                              in_stack_fffffffffffffff8);
      if (uVar1 != 0) {
        return 1;
      }
      *in_RSI = fVar2 / fVar3;
      in_RSI[1] = 1.0;
      in_RSI[2] = ((1.0 - fVar2) - fVar3) / fVar3;
    }
  }
  else {
    uVar1 = getICCChrm((float *)CONCAT44(use_icc,in_stack_00000038),(float *)icc,(LodePNGICC *)info)
    ;
    if (uVar1 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static unsigned getChrm(float m[9], float whitepoint[3], unsigned use_icc,
                        const LodePNGICC* icc, const LodePNGInfo* info) {
  size_t i;
  if(use_icc) {
    if(getICCChrm(m, whitepoint, icc)) return 1;  /* error in the matrix computations */
  } else if(info->chrm_defined && !info->srgb_defined) {
    float wx = info->chrm_white_x / 100000.0f, wy = info->chrm_white_y / 100000.0f;
    float rx = info->chrm_red_x / 100000.0f, ry = info->chrm_red_y / 100000.0f;
    float gx = info->chrm_green_x / 100000.0f, gy = info->chrm_green_y / 100000.0f;
    float bx = info->chrm_blue_x / 100000.0f, by = info->chrm_blue_y / 100000.0f;
    if(getChrmMatrixXY(m, wx, wy, rx, ry, gx, gy, bx, by)) return 1; /* returns if error */
    /* Output whitepoint, xyY to XYZ: */
    whitepoint[0] = wx / wy;
    whitepoint[1] = 1;
    whitepoint[2] = (1 - wx - wy) / wy;
  } else {
    /* the standard linear sRGB to XYZ matrix */
    static const float srgb[9] = {
        0.4124564f, 0.3575761f, 0.1804375f,
        0.2126729f, 0.7151522f, 0.0721750f,
        0.0193339f, 0.1191920f, 0.9503041f
    };
    for(i = 0; i < 9; i++) m[i] = srgb[i];
    /* sRGB's whitepoint xyY "0.3127,0.3290,1" in XYZ: */
    whitepoint[0] = 0.9504559270516716f;
    whitepoint[1] = 1;
    whitepoint[2] = 1.0890577507598784f;
  }
  return 0;
}